

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Material::~Material(Material *this)

{
  Material *this_local;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Material_0100d180;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::LayeredTexture_*>_>_>
  ::~map(&this->layeredTextures);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::Texture_*>_>_>
  ::~map(&this->textures);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr(&this->props);
  std::__cxx11::string::~string((string *)&this->shading);
  FBX::Object::~Object(&this->super_Object);
  return;
}

Assistant:

Material::~Material()
{
}